

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_num
          (int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  num_writer f;
  int iVar1;
  wchar_t wVar2;
  string_view prefix;
  locale_ref in_stack_ffffffffffffffc8;
  
  iVar1 = internal::count_digits(this->abs_value);
  wVar2 = internal::thousands_sep_impl<wchar_t>(in_stack_ffffffffffffffc8);
  iVar1 = iVar1 + (iVar1 + -1) / 3;
  f.sep = wVar2;
  f.size = iVar1;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
  ::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
              *)this->writer,iVar1,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }